

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockFor_Test<yamc::alternate::recursive_timed_mutex>::TestBody
          (TimedMutexTest_TryLockFor_Test<yamc::alternate::recursive_timed_mutex> *this)

{
  bool bVar1;
  char *message;
  size_t *in_RCX;
  anon_class_16_2_e823ffd4_for_f f;
  AssertHelper local_c8;
  Message local_c0;
  uint local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  size_t counter;
  TypeParam mtx;
  TimedMutexTest_TryLockFor_Test<yamc::alternate::recursive_timed_mutex> *this_local;
  
  yamc::alternate::recursive_timed_mutex::recursive_timed_mutex((recursive_timed_mutex *)&counter);
  local_80 = (undefined1  [8])0x0;
  f.counter = in_RCX;
  f.mtx = (TypeParam *)local_80;
  yamc::test::
  task_runner<TimedMutexTest_TryLockFor_Test<yamc::alternate::recursive_timed_mutex>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x8,(size_t)&counter,f);
  local_b4 = 80000;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b0,"10000u * 8","counter",&local_b4,(unsigned_long *)local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x111,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  yamc::alternate::recursive_timed_mutex::~recursive_timed_mutex((recursive_timed_mutex *)&counter);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockFor)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_for(TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}